

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O1

void __thiscall leveldb::TableCache::~TableCache(TableCache *this)

{
  pointer pcVar1;
  
  if (this->cache_ != (Cache *)0x0) {
    (*this->cache_->_vptr_Cache[1])();
  }
  pcVar1 = (this->dbname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->dbname_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TableCache::~TableCache() { delete cache_; }